

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

vm_obj_id_t CVmObjList::create(int in_root_set,char *lst)

{
  vm_obj_id_t obj_id;
  size_t in_RSI;
  vm_obj_id_t id;
  undefined4 in_stack_00000010;
  int in_stack_ffffffffffffffec;
  
  obj_id = vm_new_id((int)(in_RSI >> 0x20),(int)in_RSI,in_stack_ffffffffffffffec);
  CVmObject::operator_new(in_RSI,obj_id);
  CVmObjList((CVmObjList *)CONCAT44(in_root_set,in_stack_00000010),lst);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjList::create(VMG_ int in_root_set, const char *lst)
{
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, TRUE, FALSE);
    new (vmg_ id) CVmObjList(vmg_ lst);
    return id;
}